

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

void __thiscall
nonsugar::detail::parse_flag_long<std::__cxx11::string,int,void>::operator()
          (parse_flag_long<std::__cxx11::string,int,void> *this,
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *match,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *arg_it,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          arg_last,shared_ptr<int> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_int>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  const_reference pvVar2;
  char *s_00;
  char *s_01;
  shared_ptr<int> sVar3;
  shared_ptr<int> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  string_type local_b0;
  string local_90;
  string_type local_70;
  string local_50;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  pvVar2 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](match,2);
  if (pvVar2->matched == false) {
    pbVar1 = arg_it->_M_current;
    arg_it->_M_current = pbVar1 + 1;
    if (pbVar1 + 1 == arg_last._M_current) {
      widen<std::__cxx11::string>(&local_f0,(detail *)"argument required: ",s_00);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_110,match,0);
      std::operator+(&local_b0,&local_f0,&local_110);
      std::__cxx11::string::operator=((string *)err,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      goto LAB_00153140;
    }
    std::__cxx11::string::_M_assign((string *)&s);
  }
  else {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_b0,match,2);
    std::__cxx11::string::operator=((string *)&s,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  sVar3 = std::
          function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()((function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &flg->read);
  if (v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    widen<std::__cxx11::string>
              (&local_50,(detail *)"invalid argument: --",
               (char *)sVar3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _M_pi);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_70,match,1);
    std::operator+(&local_110,&local_50,&local_70);
    widen<std::__cxx11::string>(&local_90,(detail *)"=",s_01);
    std::operator+(&local_f0,&local_110,&local_90);
    std::operator+(&local_b0,&local_f0,&s);
    std::__cxx11::string::operator=((string *)err,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,
               &v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00153140:
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void operator()(
        std::match_results<typename String::const_iterator> const &match,
        Iterator &arg_it, Iterator arg_last,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        String s;
        if (!match[2].matched) {
            ++arg_it;
            if (arg_it == arg_last) {
                err = widen<String>("argument required: ") + match.str(0);
                return;
            }
            s = *arg_it;
        } else {
            s = match.str(2);
        }
        auto const v = flg.read(s);
        if (!v) {
            err = widen<String>("invalid argument: --") + match.str(1) + widen<String>("=") + s;
            return;
        }
        value = v;
    }